

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedStringFieldGenerator::GenerateAccessorDeclarations
          (RepeatedStringFieldGenerator *this,Printer *printer)

{
  FieldOptions_CType FVar1;
  CType CVar2;
  FieldOptions *this_00;
  undefined1 local_50 [7];
  bool unknown_ctype;
  Formatter format;
  Printer *printer_local;
  RepeatedStringFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  this_00 = FieldDescriptor::options((this->super_FieldGenerator).descriptor_);
  FVar1 = FieldOptions::ctype(this_00);
  CVar2 = EffectiveStringCType
                    ((this->super_FieldGenerator).descriptor_,(this->super_FieldGenerator).options_)
  ;
  if (FVar1 != CVar2) {
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>
              ((Formatter *)local_50," private:\n  // Hidden due to unknown ctype option.\n");
    Formatter::Indent((Formatter *)local_50);
  }
  Formatter::operator()
            ((Formatter *)local_50,
             "$deprecated_attr$const std::string& ${1$$name$$}$(int index) const;\n$deprecated_attr$std::string* ${1$mutable_$name$$}$(int index);\n$deprecated_attr$void ${1$set_$name$$}$(int index, const std::string& value);\n$deprecated_attr$void ${1$set_$name$$}$(int index, std::string&& value);\n$deprecated_attr$void ${1$set_$name$$}$(int index, const char* value);\n"
             ,&(this->super_FieldGenerator).descriptor_);
  if ((((this->super_FieldGenerator).options_)->opensource_runtime & 1U) == 0) {
    Formatter::operator()
              ((Formatter *)local_50,
               "$deprecated_attr$void ${1$set_$name$$}$(int index, StringPiece value);\n",
               &(this->super_FieldGenerator).descriptor_);
  }
  Formatter::operator()
            ((Formatter *)local_50,
             "$deprecated_attr$void ${1$set_$name$$}$(int index, const $pointer_type$* value, size_t size);\n$deprecated_attr$std::string* ${1$add_$name$$}$();\n$deprecated_attr$void ${1$add_$name$$}$(const std::string& value);\n$deprecated_attr$void ${1$add_$name$$}$(std::string&& value);\n$deprecated_attr$void ${1$add_$name$$}$(const char* value);\n"
             ,&(this->super_FieldGenerator).descriptor_);
  if ((((this->super_FieldGenerator).options_)->opensource_runtime & 1U) == 0) {
    Formatter::operator()
              ((Formatter *)local_50,"$deprecated_attr$void ${1$add_$name$$}$(StringPiece value);\n"
               ,&(this->super_FieldGenerator).descriptor_);
  }
  Formatter::operator()
            ((Formatter *)local_50,
             "$deprecated_attr$void ${1$add_$name$$}$(const $pointer_type$* value, size_t size);\n$deprecated_attr$const ::$proto_ns$::RepeatedPtrField<std::string>& ${1$$name$$}$() const;\n$deprecated_attr$::$proto_ns$::RepeatedPtrField<std::string>* ${1$mutable_$name$$}$();\nprivate:\nconst std::string& ${1$_internal_$name$$}$(int index) const;\nstd::string* _internal_add_$name$();\npublic:\n"
             ,&(this->super_FieldGenerator).descriptor_);
  if (FVar1 != CVar2) {
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>((Formatter *)local_50," public:\n");
    Formatter::Indent((Formatter *)local_50);
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void RepeatedStringFieldGenerator::GenerateAccessorDeclarations(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  // See comment above about unknown ctypes.
  bool unknown_ctype = descriptor_->options().ctype() !=
                       EffectiveStringCType(descriptor_, options_);

  if (unknown_ctype) {
    format.Outdent();
    format(
        " private:\n"
        "  // Hidden due to unknown ctype option.\n");
    format.Indent();
  }

  format(
      "$deprecated_attr$const std::string& ${1$$name$$}$(int index) const;\n"
      "$deprecated_attr$std::string* ${1$mutable_$name$$}$(int index);\n"
      "$deprecated_attr$void ${1$set_$name$$}$(int index, const "
      "std::string& value);\n"
      "$deprecated_attr$void ${1$set_$name$$}$(int index, std::string&& "
      "value);\n"
      "$deprecated_attr$void ${1$set_$name$$}$(int index, const "
      "char* value);\n",
      descriptor_);
  if (!options_.opensource_runtime) {
    format(
        "$deprecated_attr$void ${1$set_$name$$}$(int index, "
        "StringPiece value);\n",
        descriptor_);
  }
  format(
      "$deprecated_attr$void ${1$set_$name$$}$("
      "int index, const $pointer_type$* value, size_t size);\n"
      "$deprecated_attr$std::string* ${1$add_$name$$}$();\n"
      "$deprecated_attr$void ${1$add_$name$$}$(const std::string& value);\n"
      "$deprecated_attr$void ${1$add_$name$$}$(std::string&& value);\n"
      "$deprecated_attr$void ${1$add_$name$$}$(const char* value);\n",
      descriptor_);
  if (!options_.opensource_runtime) {
    format(
        "$deprecated_attr$void ${1$add_$name$$}$(StringPiece value);\n",
        descriptor_);
  }
  format(
      "$deprecated_attr$void ${1$add_$name$$}$(const $pointer_type$* "
      "value, size_t size)"
      ";\n"
      "$deprecated_attr$const ::$proto_ns$::RepeatedPtrField<std::string>& "
      "${1$$name$$}$() "
      "const;\n"
      "$deprecated_attr$::$proto_ns$::RepeatedPtrField<std::string>* "
      "${1$mutable_$name$$}$()"
      ";\n"
      "private:\n"
      "const std::string& ${1$_internal_$name$$}$(int index) const;\n"
      "std::string* _internal_add_$name$();\n"
      "public:\n",
      descriptor_);

  if (unknown_ctype) {
    format.Outdent();
    format(" public:\n");
    format.Indent();
  }
}